

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

bool __thiscall
GraphPropagator::coherence_innodes
          (GraphPropagator *this,int edge,vector<int,_std::allocator<int>_> *added_n)

{
  pointer pvVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  Lit LVar5;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  Lit *pLVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  BoolView *pBVar10;
  ulong uVar11;
  int u;
  long local_58;
  Clause *expl;
  vec<Lit> local_48;
  vector<int,_std::allocator<int>_> *local_38;
  
  uVar8 = 0;
  local_58 = (ulong)(uint)edge << 4;
  local_38 = added_n;
  do {
    uVar9 = (ulong)uVar8;
    pvVar1 = (this->endnodes).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar2 = *(long *)&pvVar1[edge].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data;
    uVar11 = (long)*(pointer *)
                    ((long)&pvVar1[edge].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data + 8) - lVar2 >> 2;
    if (uVar11 <= uVar9) {
LAB_001a3877:
      return uVar11 <= uVar9;
    }
    u = *(uint *)(lVar2 + uVar9 * 4);
    uVar7 = (ulong)(uint)u;
    pBVar10 = (this->vs).data;
    if (sat.assigns.data[(uint)pBVar10[uVar7].v] != '\0') {
      iVar3 = BoolView::getVal(pBVar10 + uVar7);
      if (iVar3 == 0) {
        if (so.lazy == true) {
          local_48.sz = 0;
          local_48.cap = 0;
          local_48.data = (Lit *)0x0;
          LVar5 = BoolView::getValLit((BoolView *)
                                      ((long)&(((this->es).data)->super_Var).super_Branching.
                                              _vptr_Branching + local_58));
          expl = (Clause *)CONCAT44(expl._4_4_,LVar5.x);
          vec<Lit>::push(&local_48,(Lit *)&expl);
          LVar5 = BoolView::getValLit((this->vs).data + (uint)u);
          pLVar6 = (Lit *)&expl;
          expl = (Clause *)CONCAT44(expl._4_4_,LVar5.x);
          vec<Lit>::push(&local_48,pLVar6);
          expl = Clause_new<vec<Lit>>(&local_48,SUB81(pLVar6,0));
          *(byte *)expl = *(byte *)expl | 2;
          vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&expl);
          sat.confl = expl;
          free(local_48.data);
        }
        goto LAB_001a3877;
      }
      uVar7 = (ulong)(uint)u;
      pBVar10 = (this->vs).data;
    }
    uVar4 = (uint)uVar7;
    if (sat.assigns.data[(uint)pBVar10[uVar7].v] == '\0') {
      if (so.lazy == true) {
        r._pt = Reason_new((int)pBVar10);
        LVar5 = BoolView::getValLit((BoolView *)
                                    ((long)&(((this->es).data)->super_Var).super_Branching.
                                            _vptr_Branching + local_58));
        pLVar6 = Clause::operator[](r._pt,1);
        pLVar6->x = LVar5.x;
        pBVar10 = (this->vs).data;
        uVar4 = u;
      }
      else {
        r._pt = (Clause *)0x0;
      }
      BoolView::setVal2(pBVar10 + uVar4,true,(Reason)r);
      std::vector<int,_std::allocator<int>_>::push_back(local_38,&u);
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

bool GraphPropagator::coherence_innodes(int edge, std::vector<node_id>& added_n) {
	for (unsigned int i = 0; i < endnodes[edge].size(); i++) {
		const int u = endnodes[edge][i];
		if (vs[u].isFixed() && vs[u].getVal() == 0) {
			if (so.lazy) {
				vec<Lit> ps;
				ps.push(es[edge].getValLit());
				ps.push(vs[u].getValLit());
				Clause* expl = Clause_new(ps);
				expl->temp_expl = 1;
				sat.rtrail.last().push(expl);
				sat.confl = expl;
			}
			return false;
		}
		if (!vs[u].isFixed()) {
			Clause* r = nullptr;
			if (so.lazy) {
				r = Reason_new(2);
				(*r)[1] = es[edge].getValLit();
			}
			if (GRAPHPROP_DEBUG) {
				std::cout << "COHERENCE (N) " << u << '\n';
			}
			vs[u].setVal2(true, r);
			added_n.push_back(u);
		}
	}
	return true;
}